

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genTupleStructConstructors_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  string *psVar3;
  undefined8 *puVar4;
  long *plVar5;
  pointer ppQVar6;
  TDNode *pTVar7;
  Attribute *pAVar8;
  View *pVVar9;
  CppGenerator *pCVar10;
  undefined8 *puVar11;
  long *plVar12;
  __node_base_ptr *pp_Var13;
  bitset<100UL> *pbVar14;
  element_type *peVar15;
  __buckets_ptr pp_Var16;
  _Alloc_hider *p_Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  element_type **ppeVar19;
  CppGenerator *pCVar20;
  __node_base_ptr p_Var21;
  undefined8 uVar22;
  pointer ppQVar23;
  ulong attID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string attrConstruct;
  string attrAssign;
  string tupleStruct;
  __node_base_ptr *local_1e8;
  long local_1e0;
  __node_base_ptr local_1d8;
  long lStack_1d0;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [32];
  CppGenerator *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  long lStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  element_type *local_f0;
  long lStack_e8;
  element_type *local_e0;
  char *local_d8;
  element_type *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  pointer local_c0;
  bitset<100UL> *local_b8;
  pointer local_b0;
  bitset<100UL> local_a8;
  CppGenerator *local_98 [2];
  undefined1 local_88 [40];
  _Alloc_hider _Stack_60;
  undefined1 *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string *local_38;
  
  local_168._0_8_ = local_168 + 0x10;
  local_148 = this;
  std::__cxx11::string::_M_construct((ulong)local_168,'\0');
  puVar4 = (undefined8 *)std::__cxx11::string::append(local_168);
  puVar11 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar11) {
    local_1b8 = *puVar11;
    uStack_1b0 = puVar4[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar11;
    local_1c8 = (undefined8 *)*puVar4;
  }
  local_1c0 = puVar4[1];
  *puVar4 = puVar11;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = &local_198;
  plVar12 = plVar5 + 2;
  if ((long *)*plVar5 == plVar12) {
    local_198 = *plVar12;
    lStack_190 = plVar5[3];
  }
  else {
    local_198 = *plVar12;
    local_1a8 = (long *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)plVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  pp_Var13 = (__node_base_ptr *)(plVar5 + 2);
  if ((__node_base_ptr *)*plVar5 == pp_Var13) {
    local_1d8 = *pp_Var13;
    lStack_1d0 = plVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *pp_Var13;
    local_1e8 = (__node_base_ptr *)*plVar5;
  }
  local_1e0 = plVar5[1];
  *plVar5 = (long)pp_Var13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_38 = __return_storage_ptr__;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar11) {
    local_178 = *puVar11;
    uStack_170 = puVar4[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *puVar11;
    local_188 = (undefined8 *)*puVar4;
  }
  local_180 = puVar4[1];
  *puVar4 = puVar11;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_b8 = &local_a8;
  pbVar14 = (bitset<100UL> *)(plVar5 + 2);
  if ((bitset<100UL> *)*plVar5 == pbVar14) {
    local_a8.super__Base_bitset<2UL>._M_w[0] = (pbVar14->super__Base_bitset<2UL>)._M_w[0];
    local_a8.super__Base_bitset<2UL>._M_w[1] = plVar5[3];
  }
  else {
    local_a8.super__Base_bitset<2UL>._M_w[0] = (pbVar14->super__Base_bitset<2UL>)._M_w[0];
    local_b8 = (bitset<100UL> *)*plVar5;
  }
  local_b0 = (pointer)plVar5[1];
  *plVar5 = (long)pbVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_e0 = (element_type *)&local_d0;
  peVar15 = (element_type *)(plVar5 + 2);
  if ((element_type *)*plVar5 == peVar15) {
    local_d0 = (peVar15->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    _Stack_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[3];
  }
  else {
    local_d0 = (peVar15->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    local_e0 = (element_type *)*plVar5;
  }
  local_d8 = (char *)plVar5[1];
  *plVar5 = (long)peVar15;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_88._16_8_ = local_88 + 0x20;
  pp_Var16 = (__buckets_ptr)(plVar5 + 2);
  if ((__buckets_ptr)*plVar5 == pp_Var16) {
    local_88._32_8_ = *pp_Var16;
    _Stack_60._M_p = (pointer)plVar5[3];
  }
  else {
    local_88._32_8_ = *pp_Var16;
    local_88._16_8_ = (__buckets_ptr)*plVar5;
  }
  local_88._24_8_ = plVar5[1];
  *plVar5 = (long)pp_Var16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_e0 != (element_type *)&local_d0) {
    operator_delete(local_e0);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_);
  }
  local_e0 = (element_type *)&local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  ppQVar23 = (pointer)0x0;
  do {
    ppQVar6 = (pointer)TreeDecomposition::numberOfRelations
                                 ((local_148->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
    if (ppQVar6 <= ppQVar23) {
      for (ppQVar23 = (pointer)0x0;
          ppQVar6 = (pointer)QueryCompiler::numberOfViews
                                       ((local_148->_qc).
                                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr), psVar3 = local_38, ppQVar23 < ppQVar6;
          ppQVar23 = (pointer)((long)ppQVar23 + 1)) {
        local_c0 = ppQVar23;
        pVVar9 = QueryCompiler::getView
                           ((local_148->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (size_t)ppQVar23);
        std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x2a1d5a);
        std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)local_b0,0x2a1d5a);
        pCVar10 = (CppGenerator *)0x0;
        do {
          if (((pVVar9->_fVars).super__Base_bitset<2UL>._M_w[(ulong)pCVar10 >> 6] >>
               ((ulong)pCVar10 & 0x3f) & 1) != 0) {
            pCVar20 = pCVar10;
            pAVar8 = TreeDecomposition::getAttribute
                               ((local_148->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(size_t)pCVar10);
            typeToStr_abi_cxx11_((string *)local_168,pCVar20,pAVar8->_type);
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x2a5286);
            local_1c8 = &local_1b8;
            puVar11 = puVar4 + 2;
            if ((undefined8 *)*puVar4 == puVar11) {
              local_1b8 = *puVar11;
              uStack_1b0 = puVar4[3];
            }
            else {
              local_1b8 = *puVar11;
              local_1c8 = (undefined8 *)*puVar4;
            }
            local_1c0 = puVar4[1];
            *puVar4 = puVar11;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1a8 = &local_198;
            plVar5 = puVar4 + 2;
            if ((long *)*puVar4 == plVar5) {
              local_198 = *plVar5;
              lStack_190 = puVar4[3];
            }
            else {
              local_198 = *plVar5;
              local_1a8 = (long *)*puVar4;
            }
            local_1a0 = puVar4[1];
            *puVar4 = plVar5;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1a8,(ulong)(pAVar8->_name)._M_dataplus._M_p);
            local_1e8 = &local_1d8;
            pp_Var13 = (__node_base_ptr *)(plVar5 + 2);
            if ((__node_base_ptr *)*plVar5 == pp_Var13) {
              local_1d8 = *pp_Var13;
              lStack_1d0 = plVar5[3];
            }
            else {
              local_1d8 = *pp_Var13;
              local_1e8 = (__node_base_ptr *)*plVar5;
            }
            local_1e0 = plVar5[1];
            *plVar5 = (long)pp_Var13;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
            puVar11 = puVar4 + 2;
            if ((undefined8 *)*puVar4 == puVar11) {
              local_178 = *puVar11;
              uStack_170 = puVar4[3];
              local_188 = &local_178;
            }
            else {
              local_178 = *puVar11;
              local_188 = (undefined8 *)*puVar4;
            }
            local_180 = puVar4[1];
            *puVar4 = puVar11;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_188);
            if (local_188 != &local_178) {
              operator_delete(local_188);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8);
            }
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8);
            }
            if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
              operator_delete((void *)local_168._0_8_);
            }
            local_1a8 = &local_198;
            pcVar2 = (pAVar8->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,pcVar2,pcVar2 + (pAVar8->_name)._M_string_length);
            std::__cxx11::string::append((char *)&local_1a8);
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1a8,(ulong)(pAVar8->_name)._M_dataplus._M_p);
            pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
            if ((__node_base_ptr *)*puVar4 == pp_Var13) {
              local_1d8 = *pp_Var13;
              lStack_1d0 = puVar4[3];
              local_1e8 = &local_1d8;
            }
            else {
              local_1d8 = *pp_Var13;
              local_1e8 = (__node_base_ptr *)*puVar4;
            }
            local_1e0 = puVar4[1];
            *puVar4 = pp_Var13;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
            puVar11 = puVar4 + 2;
            if ((undefined8 *)*puVar4 == puVar11) {
              local_178 = *puVar11;
              uStack_170 = puVar4[3];
              local_188 = &local_178;
            }
            else {
              local_178 = *puVar11;
              local_188 = (undefined8 *)*puVar4;
            }
            local_180 = puVar4[1];
            *puVar4 = puVar11;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_188);
            if (local_188 != &local_178) {
              operator_delete(local_188);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8);
            }
          }
          pCVar10 = (CppGenerator *)((long)&(pCVar10->super_CodeGenerator)._vptr_CodeGenerator + 1);
        } while (pCVar10 != (CppGenerator *)0x64);
        if (local_d8 == (char *)0x0) {
          local_168._0_8_ = (CppGenerator *)(local_168 + 0x10);
          std::__cxx11::string::_M_construct((ulong)local_168,'\x03');
          ppQVar23 = local_c0;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_168,
                              (ulong)local_148->viewName[(long)local_c0]._M_dataplus._M_p);
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_1b8 = *puVar11;
            uStack_1b0 = puVar4[3];
            local_1c8 = &local_1b8;
          }
          else {
            local_1b8 = *puVar11;
            local_1c8 = (undefined8 *)*puVar4;
          }
          local_1c0 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_1a8 = &local_198;
          plVar5 = puVar4 + 2;
          if ((long *)*puVar4 == plVar5) {
            local_198 = *plVar5;
            lStack_190 = puVar4[3];
          }
          else {
            local_198 = *plVar5;
            local_1a8 = (long *)*puVar4;
          }
          local_1a0 = puVar4[1];
          *puVar4 = plVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,
                              (ulong)local_148->viewName[(long)ppQVar23]._M_dataplus._M_p);
          pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
          if ((__node_base_ptr *)*puVar4 == pp_Var13) {
            local_1d8 = *pp_Var13;
            lStack_1d0 = puVar4[3];
            local_1e8 = &local_1d8;
          }
          else {
            local_1d8 = *pp_Var13;
            local_1e8 = (__node_base_ptr *)*puVar4;
          }
          local_1e0 = puVar4[1];
          *puVar4 = pp_Var13;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_178 = *puVar11;
            uStack_170 = puVar4[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *puVar11;
            local_188 = (undefined8 *)*puVar4;
          }
          local_180 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append(local_88 + 0x10,(ulong)local_188);
          if (local_188 != &local_178) {
            operator_delete(local_188);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8);
          }
          pCVar10 = (CppGenerator *)(local_168 + 0x10);
          pCVar20 = (CppGenerator *)local_168._0_8_;
        }
        else {
          std::__cxx11::string::pop_back();
          std::__cxx11::string::pop_back();
          local_98[0] = (CppGenerator *)local_88;
          std::__cxx11::string::_M_construct((ulong)local_98,'\x03');
          ppQVar23 = local_c0;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_98,
                              (ulong)local_148->viewName[(long)local_c0]._M_dataplus._M_p);
          local_140._M_allocated_capacity = (size_type)&local_130;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 == paVar18) {
            local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_130._8_8_ = puVar4[3];
          }
          else {
            local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_140._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
          }
          local_140._8_8_ = puVar4[1];
          *puVar4 = paVar18;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append(local_140._M_local_buf);
          local_100._M_allocated_capacity = (size_type)&local_f0;
          ppeVar19 = (element_type **)(puVar4 + 2);
          if ((element_type **)*puVar4 == ppeVar19) {
            local_f0 = *ppeVar19;
            lStack_e8 = puVar4[3];
          }
          else {
            local_f0 = *ppeVar19;
            local_100._M_allocated_capacity = (size_type)(element_type **)*puVar4;
          }
          local_100._8_8_ = puVar4[1];
          *puVar4 = ppeVar19;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     (local_100._M_local_buf,
                                      (ulong)local_148->viewName[(long)ppQVar23]._M_dataplus._M_p);
          local_120._M_allocated_capacity = (size_type)&local_110;
          p_Var17 = (_Alloc_hider *)(plVar5 + 2);
          if ((_Alloc_hider *)*plVar5 == p_Var17) {
            local_110._M_p = p_Var17->_M_p;
            lStack_108 = plVar5[3];
          }
          else {
            local_110._M_p = p_Var17->_M_p;
            local_120._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar5;
          }
          local_120._8_8_ = plVar5[1];
          *plVar5 = (long)p_Var17;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append(local_120._M_local_buf);
          local_168._0_8_ = local_168 + 0x10;
          pCVar10 = (CppGenerator *)(puVar4 + 2);
          if ((CppGenerator *)*puVar4 == pCVar10) {
            local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
            local_168._24_8_ = puVar4[3];
          }
          else {
            local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
            local_168._0_8_ = (CppGenerator *)*puVar4;
          }
          local_168._8_8_ = puVar4[1];
          *puVar4 = pCVar10;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_168,(ulong)local_e0);
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_1b8 = *puVar11;
            uStack_1b0 = puVar4[3];
            local_1c8 = &local_1b8;
          }
          else {
            local_1b8 = *puVar11;
            local_1c8 = (undefined8 *)*puVar4;
          }
          local_1c0 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_1a8 = &local_198;
          plVar5 = puVar4 + 2;
          if ((long *)*puVar4 == plVar5) {
            local_198 = *plVar5;
            lStack_190 = puVar4[3];
          }
          else {
            local_198 = *plVar5;
            local_1a8 = (long *)*puVar4;
          }
          local_1a0 = puVar4[1];
          *puVar4 = plVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_b8)
          ;
          pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
          if ((__node_base_ptr *)*puVar4 == pp_Var13) {
            local_1d8 = *pp_Var13;
            lStack_1d0 = puVar4[3];
            local_1e8 = &local_1d8;
          }
          else {
            local_1d8 = *pp_Var13;
            local_1e8 = (__node_base_ptr *)*puVar4;
          }
          local_1e0 = puVar4[1];
          *puVar4 = pp_Var13;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_178 = *puVar11;
            uStack_170 = puVar4[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *puVar11;
            local_188 = (undefined8 *)*puVar4;
          }
          local_180 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append(local_88 + 0x10,(ulong)local_188);
          if (local_188 != &local_178) {
            operator_delete(local_188);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8);
          }
          ppQVar23 = local_c0;
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8);
          }
          if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          if ((_Alloc_hider *)local_120._M_allocated_capacity != &local_110) {
            operator_delete((void *)local_120._M_allocated_capacity);
          }
          if ((element_type **)local_100._M_allocated_capacity != &local_f0) {
            operator_delete((void *)local_100._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_allocated_capacity != &local_130) {
            operator_delete((void *)local_140._M_allocated_capacity);
          }
          pCVar10 = (CppGenerator *)local_88;
          pCVar20 = local_98[0];
        }
        if (pCVar20 != pCVar10) {
          operator_delete(pCVar20);
        }
      }
      (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,local_88._16_8_,
                 (undefined1 *)(local_88._16_8_ + local_88._24_8_));
      std::__cxx11::string::append((char *)psVar3);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_e0 != (element_type *)&local_d0) {
        operator_delete(local_e0);
      }
      if ((undefined1 *)local_88._16_8_ != local_88 + 0x20) {
        operator_delete((void *)local_88._16_8_);
      }
      return psVar3;
    }
    pTVar7 = TreeDecomposition::getRelation
                       ((local_148->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (size_t)ppQVar23);
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar11 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar11) {
      local_178 = *puVar11;
      uStack_170 = puVar4[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *puVar11;
      local_188 = (undefined8 *)*puVar4;
    }
    local_180 = puVar4[1];
    *puVar4 = puVar11;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    local_c0 = ppQVar23;
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    attID = 0;
    do {
      if (((pTVar7->_bag).super__Base_bitset<2UL>._M_w[attID >> 6] >> (attID & 0x3f) & 1) != 0) {
        pAVar8 = TreeDecomposition::getAttribute
                           ((local_148->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,attID);
        if ((pAVar8->_constant).first == false) {
          local_100._M_allocated_capacity = (size_type)&local_f0;
          std::__cxx11::string::_M_construct((ulong)&local_100,'\t');
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x2afdd1);
          local_120._M_allocated_capacity = (size_type)&local_110;
          p_Var17 = (_Alloc_hider *)(plVar5 + 2);
          if ((_Alloc_hider *)*plVar5 == p_Var17) {
            local_110._M_p = p_Var17->_M_p;
            lStack_108 = plVar5[3];
          }
          else {
            local_110._M_p = p_Var17->_M_p;
            local_120._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar5;
          }
          local_120._8_8_ = plVar5[1];
          *plVar5 = (long)p_Var17;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append(local_120._M_local_buf);
          pCVar10 = (CppGenerator *)(puVar4 + 2);
          if ((CppGenerator *)*puVar4 == pCVar10) {
            local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
            local_168._24_8_ = puVar4[3];
            local_168._0_8_ = (CppGenerator *)(local_168 + 0x10);
          }
          else {
            local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
            local_168._0_8_ = (CppGenerator *)*puVar4;
          }
          local_168._8_8_ = puVar4[1];
          *puVar4 = pCVar10;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          typeToStr_abi_cxx11_
                    ((string *)&local_140,(CppGenerator *)(local_168 + 0x10),pAVar8->_type);
          p_Var21 = (__node_base_ptr)0xf;
          if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
            p_Var21 = (__node_base_ptr)local_168._16_8_;
          }
          if (p_Var21 < (__node_base_ptr)(local_140._8_8_ + local_168._8_8_)) {
            uVar22 = (__node_base_ptr)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_allocated_capacity != &local_130) {
              uVar22 = local_130._M_allocated_capacity;
            }
            if ((ulong)uVar22 < (__node_base_ptr)(local_140._8_8_ + local_168._8_8_))
            goto LAB_001f9f42;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,local_168._0_8_);
          }
          else {
LAB_001f9f42:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_168,local_140._M_allocated_capacity);
          }
          local_1c8 = &local_1b8;
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_1b8 = *puVar11;
            uStack_1b0 = puVar4[3];
          }
          else {
            local_1b8 = *puVar11;
            local_1c8 = (undefined8 *)*puVar4;
          }
          local_1c0 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)puVar11 = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_1a8 = &local_198;
          plVar5 = puVar4 + 2;
          if ((long *)*puVar4 == plVar5) {
            local_198 = *plVar5;
            lStack_190 = puVar4[3];
          }
          else {
            local_198 = *plVar5;
            local_1a8 = (long *)*puVar4;
          }
          local_1a0 = puVar4[1];
          *puVar4 = plVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)(pAVar8->_name)._M_dataplus._M_p);
          local_1e8 = &local_1d8;
          pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
          if ((__node_base_ptr *)*puVar4 == pp_Var13) {
            local_1d8 = *pp_Var13;
            lStack_1d0 = puVar4[3];
          }
          else {
            local_1d8 = *pp_Var13;
            local_1e8 = (__node_base_ptr *)*puVar4;
          }
          local_1e0 = puVar4[1];
          *puVar4 = pp_Var13;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
          puVar11 = puVar4 + 2;
          if ((undefined8 *)*puVar4 == puVar11) {
            local_178 = *puVar11;
            uStack_170 = puVar4[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *puVar11;
            local_188 = (undefined8 *)*puVar4;
          }
          local_180 = puVar4[1];
          *puVar4 = puVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_188);
          if (local_188 != &local_178) {
            operator_delete(local_188);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_allocated_capacity != &local_130) {
            operator_delete((void *)local_140._M_allocated_capacity);
          }
          if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          if ((_Alloc_hider *)local_120._M_allocated_capacity != &local_110) {
            operator_delete((void *)local_120._M_allocated_capacity);
          }
          if ((element_type **)local_100._M_allocated_capacity != &local_f0) {
            operator_delete((void *)local_100._M_allocated_capacity);
          }
        }
      }
      attID = attID + 1;
    } while (attID != 100);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct((ulong)&local_1c8,'\t');
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x2a3240);
    local_1a8 = &local_198;
    plVar12 = plVar5 + 2;
    if ((long *)*plVar5 == plVar12) {
      local_198 = *plVar12;
      lStack_190 = plVar5[3];
    }
    else {
      local_198 = *plVar12;
      local_1a8 = (long *)*plVar5;
    }
    local_1a0 = plVar5[1];
    *plVar5 = (long)plVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    local_1e8 = &local_1d8;
    pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
    local_168._0_8_ = local_168 + 0x10;
    if ((__node_base_ptr *)*puVar4 == pp_Var13) {
      local_1d8 = *pp_Var13;
      lStack_1d0 = puVar4[3];
    }
    else {
      local_1d8 = *pp_Var13;
      local_1e8 = (__node_base_ptr *)*puVar4;
    }
    local_1e0 = puVar4[1];
    *puVar4 = pp_Var13;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_construct((ulong)local_168,'\x03');
    p_Var21 = (__node_base_ptr)0xf;
    if (local_1e8 != &local_1d8) {
      p_Var21 = local_1d8;
    }
    if (p_Var21 < (__node_base_ptr)(local_168._8_8_ + local_1e0)) {
      p_Var21 = (__node_base_ptr)0xf;
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        p_Var21 = (__node_base_ptr)local_168._16_8_;
      }
      if (p_Var21 < (__node_base_ptr)(local_168._8_8_ + local_1e0)) goto LAB_001fa2ec;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,(ulong)local_1e8);
    }
    else {
LAB_001fa2ec:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,local_168._0_8_);
    }
    puVar11 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar11) {
      local_178 = *puVar11;
      uStack_170 = puVar4[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *puVar11;
      local_188 = (undefined8 *)*puVar4;
    }
    local_180 = puVar4[1];
    *puVar4 = puVar11;
    puVar4[1] = 0;
    *(undefined1 *)puVar11 = 0;
    std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    local_98[0] = (CppGenerator *)local_88;
    std::__cxx11::string::_M_construct((ulong)local_98,'\x03');
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)local_98,(ulong)(pTVar7->_name)._M_dataplus._M_p);
    local_140._M_allocated_capacity = (size_type)&local_130;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar18) {
      local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_130._8_8_ = puVar4[3];
    }
    else {
      local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_140._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar4;
    }
    local_140._8_8_ = puVar4[1];
    *puVar4 = paVar18;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_140._M_local_buf);
    local_100._M_allocated_capacity = (size_type)&local_f0;
    ppeVar19 = (element_type **)(plVar5 + 2);
    if ((element_type **)*plVar5 == ppeVar19) {
      local_f0 = *ppeVar19;
      lStack_e8 = plVar5[3];
    }
    else {
      local_f0 = *ppeVar19;
      local_100._M_allocated_capacity = (size_type)(element_type **)*plVar5;
    }
    local_100._8_8_ = plVar5[1];
    *plVar5 = (long)ppeVar19;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (local_100._M_local_buf,(ulong)(pTVar7->_name)._M_dataplus._M_p);
    local_120._M_allocated_capacity = (size_type)&local_110;
    p_Var17 = (_Alloc_hider *)(plVar5 + 2);
    puVar1 = local_88 + 0x40;
    if ((_Alloc_hider *)*plVar5 == p_Var17) {
      local_110._M_p = p_Var17->_M_p;
      lStack_108 = plVar5[3];
    }
    else {
      local_110._M_p = p_Var17->_M_p;
      local_120._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar5;
    }
    local_120._8_8_ = plVar5[1];
    *plVar5 = (long)p_Var17;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append(local_120._M_local_buf);
    local_168._0_8_ = local_168 + 0x10;
    pCVar10 = (CppGenerator *)(puVar4 + 2);
    if ((CppGenerator *)*puVar4 == pCVar10) {
      local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
      local_168._24_8_ = puVar4[3];
    }
    else {
      local_168._16_8_ = (pCVar10->super_CodeGenerator)._vptr_CodeGenerator;
      local_168._0_8_ = (CppGenerator *)*puVar4;
    }
    local_168._8_8_ = puVar4[1];
    *puVar4 = pCVar10;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_58 = puVar1;
    std::__cxx11::string::_M_construct((ulong)(local_88 + 0x30),'\x03');
    p_Var21 = (__node_base_ptr)0xf;
    if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
      p_Var21 = (__node_base_ptr)local_168._16_8_;
    }
    if (p_Var21 < (__node_base_ptr)(local_50._M_allocated_capacity + local_168._8_8_)) {
      uVar22 = (__node_base_ptr)0xf;
      if (local_58 != puVar1) {
        uVar22 = local_50._8_8_;
      }
      if ((ulong)uVar22 < (__node_base_ptr)(local_50._M_allocated_capacity + local_168._8_8_))
      goto LAB_001fa60d;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)(local_88 + 0x30),0,(char *)0x0,local_168._0_8_)
      ;
    }
    else {
LAB_001fa60d:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_168,(ulong)local_58);
    }
    puVar11 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar11) {
      local_1b8 = *puVar11;
      uStack_1b0 = puVar4[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar11;
      local_1c8 = (undefined8 *)*puVar4;
    }
    local_1c0 = puVar4[1];
    *puVar4 = puVar11;
    puVar4[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = &local_198;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_198 = *plVar5;
      lStack_190 = puVar4[3];
    }
    else {
      local_198 = *plVar5;
      local_1a8 = (long *)*puVar4;
    }
    local_1a0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_e0);
    local_1e8 = &local_1d8;
    pp_Var13 = (__node_base_ptr *)(puVar4 + 2);
    if ((__node_base_ptr *)*puVar4 == pp_Var13) {
      local_1d8 = *pp_Var13;
      lStack_1d0 = puVar4[3];
    }
    else {
      local_1d8 = *pp_Var13;
      local_1e8 = (__node_base_ptr *)*puVar4;
    }
    local_1e0 = puVar4[1];
    *puVar4 = pp_Var13;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar11 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar11) {
      local_178 = *puVar11;
      uStack_170 = puVar4[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *puVar11;
      local_188 = (undefined8 *)*puVar4;
    }
    local_180 = puVar4[1];
    *puVar4 = puVar11;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append(local_88 + 0x10,(ulong)local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    ppQVar23 = local_c0;
    if (local_58 != puVar1) {
      operator_delete(local_58);
    }
    if ((CppGenerator *)local_168._0_8_ != (CppGenerator *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((_Alloc_hider *)local_120._M_allocated_capacity != &local_110) {
      operator_delete((void *)local_120._M_allocated_capacity);
    }
    if ((element_type **)local_100._M_allocated_capacity != &local_f0) {
      operator_delete((void *)local_100._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_allocated_capacity != &local_130) {
      operator_delete((void *)local_140._M_allocated_capacity);
    }
    if (local_98[0] != (CppGenerator *)local_88) {
      operator_delete(local_98[0]);
    }
    ppQVar23 = (pointer)((long)ppQVar23 + 1);
  } while( true );
}

Assistant:

std::string CppGenerator::genTupleStructConstructors()
{
    std::string tupleStruct = offset(0)+"#include \"DataHandler.h\"\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n"+
        "namespace lmfao\n{\n";
    
    std::string attrConstruct = "", attrAssign = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;
        const var_bitset& bag = rel->_bag;

        attrConstruct = offset(2)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        // size_t field = 0;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);

                if (!att->_constant.first) 
                    attrConstruct += "\n"+offset(3)+"qi::"+typeToStr(att->_type)+
                        "_[phoenix::ref("+att->_name+") = qi::_1]>>";
            }
        }
        // attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct += ",\n"+offset(3)+"\'|\');\n"+offset(1);

        tupleStruct += offset(1)+relName+"_tuple::"+relName+
            "_tuple(const std::string& tuple)\n"+offset(1)+"{\n"+attrConstruct+"}\n\n";
    }

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        attrConstruct = "";
        attrAssign = "";

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* att = _td->getAttribute(var);
                attrConstruct += "const "+typeToStr(att->_type)+"& "+att->_name+",";
                attrAssign += att->_name+"("+att->_name+"),";
            }
        }        
        if (!attrConstruct.empty())
        {
            attrAssign.pop_back();
            attrConstruct.pop_back();
            
            tupleStruct +=  offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple("+attrConstruct+") : "+
                attrAssign+"{}\n\n";
        }
        else
            tupleStruct += offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple(){}\n\n";
    }
    return tupleStruct+"}\n";
}